

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeZ
          (ChElementHexaANCF_3813_9 *this,ShapeVector *Nz,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  double dVar4;
  undefined1 auVar5 [16];
  
  dVar1 = (this->m_dimensions).m_data[2];
  auVar5._8_8_ = 0x3ff0000000000000;
  auVar5._0_8_ = 0x3ff0000000000000;
  dVar4 = 0.25 / dVar1;
  auVar5 = vshufpd_avx(auVar5,auVar5,3);
  auVar2 = vpermpd_avx2(ZEXT1632(CONCAT88((x + 1.0) * dVar4,(1.0 - x) * dVar4)),0x14);
  auVar3._0_8_ = (1.0 - y) * auVar2._0_8_;
  auVar3._8_8_ = (1.0 - y) * auVar2._8_8_;
  auVar3._16_8_ = (y + auVar5._0_8_) * auVar2._16_8_;
  auVar3._24_8_ = (y + auVar5._8_8_) * auVar2._24_8_;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar2._16_8_ = 0x8000000000000000;
  auVar2._24_8_ = 0x8000000000000000;
  auVar2 = vxorpd_avx512vl(auVar3,auVar2);
  *(undefined1 (*) [32])
   (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array =
       auVar2;
  *(undefined1 (*) [32])
   ((Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array + 4)
       = auVar3;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[8] =
       0.0;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[9] =
       0.0;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[10] =
       dVar1 * z * 0.5;
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeZ(ShapeVector& Nz, double x, double y, double z) {
    double c = GetDimensions().z();
    Nz(0) = 0.25 / c * (1 - x) * (1 - y) * (-1);
    Nz(1) = 0.25 / c * (1 + x) * (1 - y) * (-1);
    Nz(2) = 0.25 / c * (1 + x) * (1 + y) * (-1);
    Nz(3) = 0.25 / c * (1 - x) * (1 + y) * (-1);
    Nz(4) = 0.25 / c * (1 - x) * (1 - y) * (+1);
    Nz(5) = 0.25 / c * (1 + x) * (1 - y) * (+1);
    Nz(6) = 0.25 / c * (1 + x) * (1 + y) * (+1);
    Nz(7) = 0.25 / c * (1 - x) * (1 + y) * (+1);
    //
    Nz(8) = 0;
    Nz(9) = 0;
    Nz(10) = c * z * (1.0 / 2.0);
}